

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::markerremove(Forth *this)

{
  bool bVar1;
  uint uVar2;
  value_type *pvVar3;
  reference this_00;
  value_type *def;
  size_t i;
  Cell defn;
  Forth *this_local;
  
  requireDStackDepth(this,1,"MARKERREMOVE");
  uVar2 = ForthStack<unsigned_int>::getTop(&this->dStack);
  ForthStack<unsigned_int>::pop(&this->dStack);
  def = (value_type *)(ulong)uVar2;
  while( true ) {
    pvVar3 = (value_type *)
             std::vector<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
             ::size(&this->definitions);
    if (pvVar3 <= def) break;
    this_00 = std::vector<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
              ::operator[](&this->definitions,(size_type)def);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&this_00->name,"_deleted");
    bVar1 = Definition::isHidden(this_00);
    if (!bVar1) {
      Definition::toggleHidden(this_00);
    }
    def = (value_type *)((long)&def->code + 1);
  }
  return;
}

Assistant:

void markerremove() {
			REQUIRE_DSTACK_DEPTH(1, "MARKERREMOVE");
			Cell defn = dStack.getTop(); dStack.pop();
			for (size_t i = defn; i<definitions.size(); ++i) {
				auto& def = definitions[i];
				def.name.append("_deleted");
				if (!def.isHidden()) {
					def.toggleHidden();
				}
			}
		}